

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmConditional(ExpressionContext *ctx,VmModule *module,ExprConditional *node)

{
  VmModule *module_00;
  VmValue *pVVar1;
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmInstruction *pVVar2;
  VmConstant *pVVar3;
  VmInstruction *valueA;
  TypeBase *pTVar4;
  uint in_R9D;
  VmInstruction *pVVar5;
  VmType type;
  VmType type_00;
  VmValue *in_stack_ffffffffffffffb8;
  
  pVVar1 = CompileVm(ctx,module,node->condition);
  block = anon_unknown.dwarf_12e14a::CreateBlock(module,(node->super_ExprBase).source,"if_true");
  block_00 = anon_unknown.dwarf_12e14a::CreateBlock(module,(node->super_ExprBase).source,"if_false")
  ;
  block_01 = anon_unknown.dwarf_12e14a::CreateBlock(module,(node->super_ExprBase).source,"if_exit");
  anon_unknown.dwarf_12e14a::CreateJumpNotZero
            (module,(node->super_ExprBase).source,pVVar1,&block->super_VmValue,
             &block_00->super_VmValue);
  if (node->trueBlock->type != node->falseBlock->type) {
    __assert_fail("node->trueBlock->type == node->falseBlock->type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xbf4,
                  "VmValue *CompileVmConditional(ExpressionContext &, VmModule *, ExprConditional *)"
                 );
  }
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  pVVar2 = (VmInstruction *)CompileVm(ctx,module,node->trueBlock);
  if (pVVar2 == (VmInstruction *)0x0) {
    valueA = (VmInstruction *)0x0;
  }
  else {
    valueA = pVVar2;
    if ((pVVar2->super_VmValue).typeID == 1) {
      module_00 = (VmModule *)(node->super_ExprBase).source;
      if ((pVVar2->super_VmValue).type.type == VM_TYPE_STRUCT) {
        pVVar3 = anon_unknown.dwarf_12e14a::CreateAlloca
                           (ctx,module,(SynBase *)module_00,node->trueBlock->type,"cond",true);
        anon_unknown.dwarf_12e14a::CreateStore
                  (ctx,module,(node->super_ExprBase).source,node->trueBlock->type,
                   &pVVar3->super_VmValue,(VmValue *)pVVar2,0);
        in_R9D = (uint)pVVar2;
        goto LAB_001a9151;
      }
      type.structType = (TypeBase *)0x7;
      type._0_8_ = (pVVar2->super_VmValue).type.structType;
      valueA = anon_unknown.dwarf_12e14a::CreateInstruction
                         ((anon_unknown_dwarf_12e14a *)module,module_00,
                          *(SynBase **)&(pVVar2->super_VmValue).type,type,(VmInstructionType)pVVar2,
                          (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                          in_stack_ffffffffffffffb8);
      in_R9D = (uint)pVVar2;
    }
  }
  pVVar3 = (VmConstant *)0x0;
LAB_001a9151:
  anon_unknown.dwarf_12e14a::CreateJump
            (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_00);
  module->currentBlock = block_00;
  pVVar2 = (VmInstruction *)CompileVm(ctx,module,node->falseBlock);
  if (pVVar2 == (VmInstruction *)0x0) {
    pVVar2 = (VmInstruction *)0x0;
  }
  else if ((pVVar2->super_VmValue).typeID == 1) {
    if ((pVVar2->super_VmValue).type.type == VM_TYPE_STRUCT) {
      if (pVVar3 == (VmConstant *)0x0) {
        __assert_fail("tempAddress",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xc16,
                      "VmValue *CompileVmConditional(ExpressionContext &, VmModule *, ExprConditional *)"
                     );
      }
      pVVar5 = pVVar2;
      anon_unknown.dwarf_12e14a::CreateStore
                (ctx,module,(node->super_ExprBase).source,node->falseBlock->type,
                 &pVVar3->super_VmValue,(VmValue *)pVVar2,0);
      in_R9D = (uint)pVVar5;
    }
    else {
      type_00.structType = (TypeBase *)0x7;
      type_00._0_8_ = (pVVar2->super_VmValue).type.structType;
      pVVar5 = pVVar2;
      pVVar2 = anon_unknown.dwarf_12e14a::CreateInstruction
                         ((anon_unknown_dwarf_12e14a *)module,
                          (VmModule *)(node->super_ExprBase).source,
                          *(SynBase **)&(pVVar2->super_VmValue).type,type_00,
                          (VmInstructionType)pVVar2,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                          (VmValue *)0x0,in_stack_ffffffffffffffb8);
      in_R9D = (uint)pVVar5;
    }
  }
  anon_unknown.dwarf_12e14a::CreateJump
            (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  VmFunction::AddBlock(module->currentFunction,block_01);
  module->currentBlock = block_01;
  if (pVVar3 == (VmConstant *)0x0) {
    pTVar4 = (node->super_ExprBase).type;
    if (pTVar4->size == 0) {
      pVVar3 = CreateConstantStruct
                         (ctx->allocator,(node->super_ExprBase).source,(char *)0x0,0,pTVar4);
      return &pVVar3->super_VmValue;
    }
    if ((valueA == (VmInstruction *)0x0) || ((valueA->super_VmValue).typeID != 2)) {
      valueA = (VmInstruction *)0x0;
    }
    if ((pVVar2 == (VmInstruction *)0x0) || ((pVVar2->super_VmValue).typeID != 2)) {
      pVVar2 = (VmInstruction *)0x0;
    }
    pVVar1 = anon_unknown.dwarf_12e14a::CreatePhi
                       (module,(node->super_ExprBase).source,valueA,pVVar2);
    pTVar4 = (node->super_ExprBase).type;
  }
  else {
    pVVar1 = anon_unknown.dwarf_12e14a::CreateLoad
                       (ctx,module,(node->super_ExprBase).source,node->falseBlock->type,
                        &pVVar3->super_VmValue,in_R9D);
    pTVar4 = (node->super_ExprBase).type;
  }
  anon_unknown.dwarf_12e14a::CheckType(ctx,(ExprBase *)pTVar4,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmConditional(ExpressionContext &ctx, VmModule *module, ExprConditional *node)
{
	VmValue* condition = CompileVm(ctx, module, node->condition);

	VmBlock *trueBlock = CreateBlock(module, node->source, "if_true");
	VmBlock *falseBlock = CreateBlock(module, node->source, "if_false");
	VmBlock *exitBlock = CreateBlock(module, node->source, "if_exit");

	CreateJumpNotZero(module, node->source, condition, trueBlock, falseBlock);

	assert(node->trueBlock->type == node->falseBlock->type);

	module->currentFunction->AddBlock(trueBlock);
	module->currentBlock = trueBlock;

	VmConstant *tempAddress = NULL;

	VmValue *trueValue = CompileVm(ctx, module, node->trueBlock);

	if(VmConstant *constant = getType<VmConstant>(trueValue))
	{
		if(constant->type.type == VM_TYPE_STRUCT)
		{
			tempAddress = CreateAlloca(ctx, module, node->source, node->trueBlock->type, "cond", true);

			CreateStore(ctx, module, node->source, node->trueBlock->type, tempAddress, constant, 0);
		}
		else
		{
			trueValue = CreateLoadImmediate(module, node->source, constant);
		}
	}

	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(falseBlock);
	module->currentBlock = falseBlock;

	VmValue *falseValue = CompileVm(ctx, module, node->falseBlock);

	if(VmConstant *constant = getType<VmConstant>(falseValue))
	{
		if(constant->type.type == VM_TYPE_STRUCT)
		{
			assert(tempAddress);

			CreateStore(ctx, module, node->source, node->falseBlock->type, tempAddress, constant, 0);
		}
		else
		{
			falseValue = CreateLoadImmediate(module, node->source, constant);
		}
	}

	CreateJump(module, node->source, exitBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	if(tempAddress)
		return CheckType(ctx, node, CreateLoad(ctx, module, node->source, node->falseBlock->type, tempAddress, 0));

	if(node->type->size == 0)
		return CreateConstantStruct(ctx.allocator, node->source, NULL, 0, node->type);

	VmValue *phi = CreatePhi(module, node->source, getType<VmInstruction>(trueValue), getType<VmInstruction>(falseValue));

	return CheckType(ctx, node, phi);
}